

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

void __thiscall
wallet::OutputGroup::Insert
          (OutputGroup *this,shared_ptr<wallet::COutput> *output,size_t ancestors,size_t descendants
          )

{
  int iVar1;
  long lVar2;
  COutput *this_00;
  CAmount CVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::push_back(&this->m_outputs,output);
  this_00 = (this->m_outputs).
            super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  CVar3 = COutput::GetFee(this_00);
  this->fee = this->fee + CVar3;
  if (this_00->input_bytes < 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = CFeeRate::GetFee(&this->m_long_term_feerate,this_00->input_bytes);
  }
  this_00->long_term_fee = lVar4;
  this->long_term_fee = this->long_term_fee + lVar4;
  CVar3 = COutput::GetEffectiveValue(this_00);
  this->effective_value = this->effective_value + CVar3;
  this->m_from_me = (bool)(this->m_from_me & this_00->from_me);
  this->m_value = this->m_value + (this_00->txout).nValue;
  iVar1 = this->m_depth;
  if (this_00->depth < this->m_depth) {
    iVar1 = this_00->depth;
  }
  this->m_depth = iVar1;
  this->m_ancestors = this->m_ancestors + ancestors;
  if (descendants < this->m_descendants) {
    descendants = this->m_descendants;
  }
  this->m_descendants = descendants;
  iVar1 = ((output->super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          input_bytes;
  if (0 < iVar1) {
    this->m_weight = this->m_weight + iVar1 * 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void OutputGroup::Insert(const std::shared_ptr<COutput>& output, size_t ancestors, size_t descendants) {
    m_outputs.push_back(output);
    auto& coin = *m_outputs.back();

    fee += coin.GetFee();

    coin.long_term_fee = coin.input_bytes < 0 ? 0 : m_long_term_feerate.GetFee(coin.input_bytes);
    long_term_fee += coin.long_term_fee;

    effective_value += coin.GetEffectiveValue();

    m_from_me &= coin.from_me;
    m_value += coin.txout.nValue;
    m_depth = std::min(m_depth, coin.depth);
    // ancestors here express the number of ancestors the new coin will end up having, which is
    // the sum, rather than the max; this will overestimate in the cases where multiple inputs
    // have common ancestors
    m_ancestors += ancestors;
    // descendants is the count as seen from the top ancestor, not the descendants as seen from the
    // coin itself; thus, this value is counted as the max, not the sum
    m_descendants = std::max(m_descendants, descendants);

    if (output->input_bytes > 0) {
        m_weight += output->input_bytes * WITNESS_SCALE_FACTOR;
    }
}